

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

pair<bool,_bool> __thiscall
slang::ast::Compilation::isReferenced(Compilation *this,SyntaxNode *node)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  pair<bool,_bool> pVar8;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  value_type *elements;
  ulong uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  byte bVar18;
  undefined1 auVar19 [16];
  undefined2 uVar9;
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = node;
  uVar12 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar10 = uVar12 >> ((byte)(this->referenceStatusMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar12 & 0xff];
  ppVar3 = (this->referenceStatusMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
           .arrays.elements_;
  uVar4 = (this->referenceStatusMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
          .arrays.groups_size_mask;
  uVar14 = 0;
  do {
    pgVar1 = (this->referenceStatusMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
             .arrays.groups_ + uVar10;
    bVar7 = pgVar1->m[0xf].n;
    uVar15 = (uchar)uVar2;
    auVar19[0] = -(pgVar1->m[0].n == uVar15);
    uVar16 = (uchar)((uint)uVar2 >> 8);
    auVar19[1] = -(pgVar1->m[1].n == uVar16);
    uVar17 = (uchar)((uint)uVar2 >> 0x10);
    auVar19[2] = -(pgVar1->m[2].n == uVar17);
    bVar18 = (byte)((uint)uVar2 >> 0x18);
    auVar19[3] = -(pgVar1->m[3].n == bVar18);
    auVar19[4] = -(pgVar1->m[4].n == uVar15);
    auVar19[5] = -(pgVar1->m[5].n == uVar16);
    auVar19[6] = -(pgVar1->m[6].n == uVar17);
    auVar19[7] = -(pgVar1->m[7].n == bVar18);
    auVar19[8] = -(pgVar1->m[8].n == uVar15);
    auVar19[9] = -(pgVar1->m[9].n == uVar16);
    auVar19[10] = -(pgVar1->m[10].n == uVar17);
    auVar19[0xb] = -(pgVar1->m[0xb].n == bVar18);
    auVar19[0xc] = -(pgVar1->m[0xc].n == uVar15);
    auVar19[0xd] = -(pgVar1->m[0xd].n == uVar16);
    auVar19[0xe] = -(pgVar1->m[0xe].n == uVar17);
    auVar19[0xf] = -(bVar7 == bVar18);
    for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe); uVar13 != 0;
        uVar13 = uVar13 - 1 & uVar13) {
      iVar5 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
        }
      }
      if (*(SyntaxNode **)((long)&ppVar3[uVar10 * 0xf].first + (ulong)(uint)(iVar5 << 4)) == node) {
        return *(pair<bool,_bool> *)(&ppVar3[uVar10 * 0xf].second.first + (uint)(iVar5 << 4));
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & bVar7) == 0) {
      uVar9._0_1_ = false;
      uVar9._1_1_ = false;
      return (pair<bool,_bool>)uVar9;
    }
    lVar11 = uVar10 + uVar14;
    uVar14 = uVar14 + 1;
    uVar10 = lVar11 + 1U & uVar4;
  } while (uVar14 <= uVar4);
  pVar8.first = false;
  pVar8.second = false;
  return pVar8;
}

Assistant:

std::pair<bool, bool> Compilation::isReferenced(const SyntaxNode& node) const {
    auto it = referenceStatusMap.find(&node);
    if (it == referenceStatusMap.end())
        return {false, false};

    return it->second;
}